

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

void __thiscall
ON_Evaluator::ON_Evaluator
          (ON_Evaluator *this,int parameter_count,int value_count,ON_Interval *domain,bool *periodic
          )

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  bool local_41;
  ON_SimpleArray<bool> *local_40;
  bool *local_38;
  
  this->_vptr_ON_Evaluator = (_func_int **)&PTR__ON_Evaluator_00813a38;
  if (value_count < 1) {
    value_count = parameter_count;
  }
  this->m_parameter_count = parameter_count;
  this->m_value_count = value_count;
  (this->m_domain)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00813a78;
  (this->m_domain).m_a = (ON_Interval *)0x0;
  (this->m_domain).m_count = 0;
  (this->m_domain).m_capacity = 0;
  (this->m_bPeriodicParameter)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00809cc8;
  (this->m_bPeriodicParameter).m_a = (bool *)0x0;
  (this->m_bPeriodicParameter).m_count = 0;
  (this->m_bPeriodicParameter).m_capacity = 0;
  if (parameter_count != 0 && domain != (ON_Interval *)0x0) {
    local_40 = &this->m_bPeriodicParameter;
    local_38 = periodic;
    ON_SimpleArray<ON_Interval>::SetCapacity(&this->m_domain,(long)parameter_count);
    if (0 < parameter_count) {
      uVar2 = (ulong)(uint)parameter_count;
      do {
        ON_SimpleArray<ON_Interval>::Append(&this->m_domain,domain);
        domain = domain + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      if (local_38 != (bool *)0x0 && 0 < parameter_count) {
        uVar2 = 0;
        do {
          if (local_38[uVar2] == true) {
            uVar1 = this->m_parameter_count;
            if ((uint)(this->m_bPeriodicParameter).m_capacity < uVar1) {
              ON_SimpleArray<bool>::SetCapacity(local_40,(long)(int)uVar1);
              uVar1 = this->m_parameter_count;
            }
            if ((int)uVar1 < 1) {
              return;
            }
            lVar3 = 0;
            do {
              local_41 = local_38[lVar3];
              ON_SimpleArray<bool>::Append(local_40,&local_41);
              lVar3 = lVar3 + 1;
            } while (lVar3 < this->m_parameter_count);
            return;
          }
          uVar2 = uVar2 + 1;
        } while ((uint)parameter_count != uVar2);
      }
    }
  }
  return;
}

Assistant:

ON_Evaluator::ON_Evaluator( 
                           int parameter_count,
                           int value_count,
                           const ON_Interval* domain,
                           const bool* periodic
                           )
             : m_parameter_count(parameter_count),
               m_value_count(value_count>0?value_count:parameter_count)
{
  int i;

  if (domain)
  {
    m_domain.Reserve(m_parameter_count);
    for ( i = 0; i < parameter_count; i++ )
      m_domain.Append(domain[i]);

    if (periodic )
    {
      for ( i = 0; i < parameter_count; i++ )
      {
        if  (periodic[i])
        {
          m_bPeriodicParameter.Reserve(m_parameter_count);
          for ( i = 0; i < m_parameter_count; i++ )
          {
            m_bPeriodicParameter.Append(periodic[i]?true:false);
          }
          break;
        }
      }
    }
  }
}